

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O2

void duckdb::ExportAggregateFinalize
               (Vector *state,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  aggregate_size_t p_Var1;
  data_ptr_t pdVar2;
  FunctionData *pFVar3;
  pointer pBVar4;
  char *data;
  idx_t len;
  idx_t iVar5;
  data_ptr_t pdVar6;
  string_t sVar7;
  
  len = count;
  pFVar3 = optional_ptr<duckdb::FunctionData,_true>::operator->(&aggr_input_data->bind_data);
  pBVar4 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                         *)(pFVar3 + 1));
  p_Var1 = (pBVar4->function).state_size;
  pBVar4 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                         *)(pFVar3 + 1));
  data = (char *)(*p_Var1)(&pBVar4->function);
  pdVar2 = state->data;
  pdVar6 = result->data + 8;
  for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
    sVar7 = StringVector::AddStringOrBlob
                      ((StringVector *)result,*(Vector **)(pdVar2 + iVar5 * 8),data,len);
    *(long *)(pdVar6 + -8) = sVar7.value._0_8_;
    *(long *)pdVar6 = sVar7.value._8_8_;
    pdVar6 = pdVar6 + 0x10;
  }
  return;
}

Assistant:

static void ExportAggregateFinalize(Vector &state, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
                                    idx_t offset) {
	D_ASSERT(offset == 0);
	auto &bind_data = aggr_input_data.bind_data->Cast<ExportAggregateFunctionBindData>();
	auto state_size = bind_data.aggregate->function.state_size(bind_data.aggregate->function);
	auto blob_ptr = FlatVector::GetData<string_t>(result);
	auto addresses_ptr = FlatVector::GetData<data_ptr_t>(state);
	for (idx_t row_idx = 0; row_idx < count; row_idx++) {
		auto data_ptr = addresses_ptr[row_idx];
		blob_ptr[row_idx] = StringVector::AddStringOrBlob(result, const_char_ptr_cast(data_ptr), state_size);
	}
}